

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void runtime::printConstantArray<long>(ostream *out,vector<long,_std::allocator<long>_> *vec)

{
  pointer plVar1;
  ostream *poVar2;
  long *val;
  pointer plVar3;
  
  plVar1 = (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (plVar3 = (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start; plVar3 != plVar1; plVar3 = plVar3 + 1) {
    poVar2 = std::operator<<(out,"| |");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"| ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,'\n');
  }
  return;
}

Assistant:

void printConstantArray(std::ostream & out, const std::vector<T> & vec) {
  std::size_t i = 0;
  for (const auto& val : vec) {
    out << "| |" << i << "| " << val << '\n';
    i++;
  }
}